

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void vdbeSorterExtendFile(sqlite3 *db,sqlite3_file *pFd,i64 nByte)

{
  int chunksize;
  void *p;
  i64 local_30;
  undefined4 local_24;
  void *local_20;
  
  if ((nByte <= (int)db) && (2 < pFd->pMethods->iVersion)) {
    local_20 = (void *)0x0;
    local_24 = 0x1000;
    local_30 = nByte;
    (*pFd->pMethods->xFileControl)(pFd,6,&local_24);
    (*pFd->pMethods->xFileControl)(pFd,5,&local_30);
    (*pFd->pMethods->xFetch)(pFd,0,(int)local_30,&local_20);
    if (local_20 != (void *)0x0) {
      (*pFd->pMethods->xUnfetch)(pFd,0,local_20);
    }
  }
  return;
}

Assistant:

static void vdbeSorterExtendFile(sqlite3 *db, sqlite3_file *pFd, i64 nByte){
  if( nByte<=(i64)(db->nMaxSorterMmap) && pFd->pMethods->iVersion>=3 ){
    void *p = 0;
    int chunksize = 4*1024;
    sqlite3OsFileControlHint(pFd, SQLITE_FCNTL_CHUNK_SIZE, &chunksize);
    sqlite3OsFileControlHint(pFd, SQLITE_FCNTL_SIZE_HINT, &nByte);
    sqlite3OsFetch(pFd, 0, (int)nByte, &p);
    if( p ) sqlite3OsUnfetch(pFd, 0, p);
  }
}